

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void duckdb::FSSTStorage::StringScanPartial<true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  optional_ptr<duckdb::FileBuffer,_true> *this;
  bool bVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  BlockManager *pBVar4;
  undefined4 uVar5;
  FSSTScanState *scan_state;
  idx_t start;
  DBConfig *pDVar6;
  ulong uVar7;
  BlockHandle *pBVar8;
  idx_t iVar9;
  idx_t iVar10;
  VectorStringBuffer *str_buffer;
  long lVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  data_ptr_t pdVar14;
  idx_t iVar15;
  uint uVar16;
  idx_t iVar17;
  string_t sVar18;
  anon_union_16_2_67f50693_for_value aVar19;
  bp_delta_offsets_t offsets;
  idx_t local_a0;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  ColumnSegment *local_70;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pDVar6 = DBConfig::GetConfig(segment->db);
  bVar1 = (pDVar6->options).enable_fsst_vectors;
  this = &(scan_state->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar3 = ((scan_state->super_StringScanState).handle.node.ptr)->buffer;
  iVar15 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  if (scan_count != 0) {
    uVar7 = (ulong)*(uint *)(((scan_state->super_StringScanState).handle.node.ptr)->buffer +
                            segment->offset + 4);
    if (bVar1 == false) {
      pdVar13 = result->data;
      StartScan(&local_68,scan_state,pdVar3 + iVar15 + 0x10,start,scan_count);
      str_buffer = StringVector::GetStringBuffer(result);
      pdVar13 = pdVar13 + result_offset * 0x10 + 8;
      local_a0 = local_68.unused_delta_decoded_values;
      iVar9 = local_68.scan_offset;
      iVar10 = local_68.unused_delta_decoded_values;
      iVar17 = scan_count;
      do {
        uVar12 = (ulong)(scan_state->bitunpack_buffer).
                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar9];
        lVar11 = (long)(int)(scan_state->delta_decode_buffer).
                            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                            _M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar10];
        pdVar14 = pdVar3 + ((uVar7 + iVar15) - lVar11);
        if (lVar11 == 0) {
          pdVar14 = (data_ptr_t)0x0;
        }
        if (uVar12 == 0) {
          uVar12 = 0;
          aVar19 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
        }
        else {
          if (scan_state->all_values_inlined == true) {
            aVar19.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 FSSTPrimitives::DecompressInlinedValue
                           (scan_state->duckdb_fsst_decoder_ptr,(char *)pdVar14,uVar12);
          }
          else {
            aVar19.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 FSSTPrimitives::DecompressValue
                           (scan_state->duckdb_fsst_decoder_ptr,str_buffer,(char *)pdVar14,uVar12);
          }
          uVar12 = aVar19._0_8_ & 0xffffffff00000000;
        }
        *(ulong *)(pdVar13 + -8) = aVar19.pointer.length | uVar12;
        *(char **)pdVar13 = aVar19.pointer.ptr;
        iVar9 = iVar9 + 1;
        iVar10 = iVar10 + 1;
        pdVar13 = pdVar13 + 0x10;
        iVar17 = iVar17 - 1;
      } while (iVar17 != 0);
    }
    else {
      local_70 = segment;
      if ((scan_state->duckdb_fsst_decoder).internal.
          super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
        Vector::SetVectorType(result,FSST_VECTOR);
        pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&local_70->block);
        pBVar4 = pBVar8->block_manager;
        iVar9 = optional_idx::GetIndex(&pBVar4->block_alloc_size);
        iVar10 = optional_idx::GetIndex(&pBVar4->block_header_size);
        iVar9 = iVar9 - iVar10 >> 2 & 0xfffffffffffffff8;
        if (0xfff < iVar9) {
          iVar9 = 0x1000;
        }
        FSSTVector::RegisterDecoder(result,&scan_state->duckdb_fsst_decoder,iVar9);
      }
      pdVar13 = result->data;
      StartScan(&local_68,scan_state,pdVar3 + iVar15 + 0x10,start,scan_count);
      lVar11 = uVar7 + iVar15;
      pdVar13 = pdVar13 + 8;
      local_a0 = local_68.unused_delta_decoded_values;
      iVar15 = 0;
      do {
        uVar2 = (scan_state->delta_decode_buffer).
                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                [local_68.unused_delta_decoded_values + iVar15];
        if ((long)(int)uVar2 < 0) {
          sVar18 = UncompressedStringStorage::ReadOverflowString
                             (local_70,result,*(block_id_t *)(pdVar3 + (lVar11 - (ulong)-uVar2)),
                              (int32_t)*(block_id_t *)
                                        ((long)(pdVar3 + (lVar11 - (ulong)-uVar2)) + 8));
          pdVar14 = sVar18.value._8_8_;
          uVar16 = sVar18.value._0_4_;
          uVar5 = sVar18.value._4_4_;
        }
        else {
          uVar16 = (scan_state->bitunpack_buffer).
                   super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                   [local_68.scan_offset + iVar15];
          pdVar14 = pdVar3 + (lVar11 - (int)uVar2);
          if (uVar16 < 0xd) {
            local_78 = 0;
            local_80 = 0;
            uStack_7c = 0;
            if (uVar16 == 0) {
              uVar5 = 0;
              uVar16 = 0;
              pdVar14 = (data_ptr_t)0x0;
            }
            else {
              switchD_012b9b0d::default(&local_80,pdVar14,(ulong)uVar16);
              pdVar14 = (data_ptr_t)CONCAT44(local_78,uStack_7c);
              uVar5 = local_80;
            }
          }
          else {
            uVar5 = *(undefined4 *)pdVar14;
          }
        }
        *(uint *)(pdVar13 + -8) = uVar16;
        *(undefined4 *)(pdVar13 + -4) = uVar5;
        *(data_ptr_t *)pdVar13 = pdVar14;
        FSSTVector::SetCount(result,scan_count);
        iVar15 = iVar15 + 1;
        pdVar13 = pdVar13 + 0x10;
      } while (scan_count != iVar15);
    }
    scan_state->last_known_index =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
         [local_a0 + scan_count + 0xffffffffffffffff];
    scan_state->last_known_row = scan_count + start + -1;
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}